

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtentBuilder.h
# Opt level: O0

Extent<double> *
Parfait::ExtentBuilder::intersection<double>
          (Extent<double> *__return_storage_ptr__,Extent<double> *e1,Extent<double> *e2)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  double local_58;
  double local_40;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Extent<double> *e2_local;
  Extent<double> *e1_local;
  
  bVar2 = Extent<double>::contains(e1,e2);
  if (bVar2) {
    Extent<double>::Extent(__return_storage_ptr__);
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      pdVar3 = Point<double>::operator[](&e1->lo,local_1c);
      dVar1 = *pdVar3;
      pdVar3 = Point<double>::operator[](&e2->lo,local_1c);
      if (*pdVar3 <= dVar1) {
        pdVar3 = Point<double>::operator[](&e1->lo,local_1c);
        local_40 = *pdVar3;
      }
      else {
        pdVar3 = Point<double>::operator[](&e2->lo,local_1c);
        local_40 = *pdVar3;
      }
      pdVar3 = Point<double>::operator[](&__return_storage_ptr__->lo,local_1c);
      *pdVar3 = local_40;
    }
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pdVar3 = Point<double>::operator[](&e1->hi,local_20);
      dVar1 = *pdVar3;
      pdVar3 = Point<double>::operator[](&e2->hi,local_20);
      if (dVar1 < *pdVar3 || dVar1 == *pdVar3) {
        pdVar3 = Point<double>::operator[](&e1->hi,local_20);
        local_58 = *pdVar3;
      }
      else {
        pdVar3 = Point<double>::operator[](&e2->hi,local_20);
        local_58 = *pdVar3;
      }
      pdVar3 = Point<double>::operator[](&__return_storage_ptr__->hi,local_20);
      *pdVar3 = local_58;
    }
  }
  else {
    createEmptyBuildableExtent<double>();
  }
  return __return_storage_ptr__;
}

Assistant:

Extent<T> intersection(Extent<T>& e1, const Extent<T>& e2) {
            if(not e1.contains(e2))
                return createEmptyBuildableExtent<T>();
            Extent<T> e;
            for(int i = 0; i < 3; i++)
                e.lo[i] = (e1.lo[i] < e2.lo[i])?(e2.lo[i]):(e1.lo[i]);

            for(int i = 0; i < 3; i++)
                e.hi[i] = (e1.hi[i] > e2.hi[i])?(e2.hi[i]):(e1.hi[i]);
            return e;
        }